

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnBrOnExnExpr
          (BinaryReaderIR *this,Index depth,Index event_index)

{
  Result RVar1;
  pointer *__ptr;
  Expr *local_a8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_a0;
  Location local_98;
  Var local_78;
  
  MakeUnique<wabt::BrOnExnExpr>();
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,depth,&local_98);
  Var::operator=((Var *)(local_a8 + 1),&local_78);
  Var::~Var(&local_78);
  local_98.field_1.field_0.line = 0;
  local_98.field_1._4_8_ = 0;
  local_98.filename.data_ = (char *)0x0;
  local_98.filename.size_._0_4_ = 0;
  local_98.filename.size_._4_4_ = 0;
  Var::Var(&local_78,event_index,&local_98);
  Var::operator=((Var *)&local_a8[2].super_intrusive_list_base<wabt::Expr>,&local_78);
  Var::~Var(&local_78);
  local_a0._M_head_impl = local_a8;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_a0);
  if (local_a0._M_head_impl != (Expr *)0x0) {
    (*(local_a0._M_head_impl)->_vptr_Expr[1])();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrOnExnExpr(Index depth, Index event_index) {
  auto expr = MakeUnique<BrOnExnExpr>();
  expr->label_var = Var(depth);
  expr->event_var = Var(event_index);
  return AppendExpr(std::move(expr));
}